

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O0

Am_Value_List * __thiscall
Am_Value_List::Add(Am_Value_List *this,Am_Generic_Procedure *value,Am_Add_Position position,
                  bool unique)

{
  Am_Value_List_Data *this_00;
  undefined1 local_40 [8];
  Am_Value store;
  bool unique_local;
  Am_Add_Position position_local;
  Am_Generic_Procedure *value_local;
  Am_Value_List *this_local;
  
  if (this->data == (Am_Value_List_Data *)0x0) {
    this_00 = (Am_Value_List_Data *)operator_new(0x20);
    Am_Value_List_Data::Am_Value_List_Data(this_00);
    this->data = this_00;
  }
  else if (unique) {
    Am_Value_List_Data::Make_Unique(this->data,&this->data,&this->item);
  }
  Am_Value::Am_Value((Am_Value *)local_40,value);
  Am_Value_List_Data::Add(this->data,(Am_Value *)local_40,position);
  Am_Value::~Am_Value((Am_Value *)local_40);
  return this;
}

Assistant:

bool Am_Value_List::Start_Member(
                                            const Am_Value &value)
{
  Start();
  return Member(value);
}